

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inlining.cpp
# Opt level: O2

unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> __thiscall
wasm::anon_unknown_18::FunctionInfoScanner::create(FunctionInfoScanner *this)

{
  NameInfoMap *infos;
  FunctionInfoScanner *this_00;
  long in_RSI;
  
  infos = *(NameInfoMap **)(in_RSI + 0x130);
  this_00 = (FunctionInfoScanner *)operator_new(0x138);
  FunctionInfoScanner(this_00,infos);
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionInfoScanner,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionInfoScanner,_void>_>_>
  ).super_Pass._vptr_Pass = (_func_int **)this_00;
  return (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)
         (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Pass> create() override {
    return std::make_unique<FunctionInfoScanner>(infos);
  }